

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::log_contexts(JUnitReporter *this,ostringstream *s)

{
  int iVar1;
  IContextScope **ppIVar2;
  ostream *in_RSI;
  char *pcVar3;
  int i;
  IContextScope **contexts;
  int num_contexts;
  int local_24;
  
  iVar1 = IReporter::get_num_active_contexts();
  if (iVar1 != 0) {
    ppIVar2 = IReporter::get_active_contexts();
    std::operator<<(in_RSI,"  logged: ");
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      pcVar3 = "          ";
      if (local_24 == 0) {
        pcVar3 = "";
      }
      std::operator<<(in_RSI,pcVar3);
      (*ppIVar2[local_24]->_vptr_IContextScope[2])(ppIVar2[local_24],in_RSI);
      std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void log_contexts(std::ostringstream& s) {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << std::endl;
                }
            }
        }